

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  
  ints();
  special();
  floats();
  doubles();
  huge_ints();
  timestamps();
  midi();
  blobs();
  arrays();
  ranges();
  different_types();
  multiple_args();
  different_sizes();
  iVar1 = test_summary();
  return iVar1;
}

Assistant:

int main()
{
    ints();
    special();
    floats();
    doubles();
    huge_ints();
    timestamps();
    midi();
    blobs();
    arrays();
    ranges();
    different_types();
    multiple_args();
    different_sizes();

    return test_summary();
}